

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O2

ShapeRange * __thiscall
CoreML::ShapeRange::operator-(ShapeRange *__return_storage_ptr__,ShapeRange *this,ShapeRange *other)

{
  RangeValue RVar1;
  RangeValue local_48;
  RangeValue local_38;
  
  ShapeRange(__return_storage_ptr__);
  local_48._isUnbound = (other->_maximum)._isUnbound;
  if ((local_48._isUnbound != true) || ((this->_maximum)._isUnbound == false)) {
    local_48._val = (other->_maximum)._val;
    RVar1 = RangeValue::operator-(&this->_minimum,&local_48);
    local_38._val = RVar1._val;
    local_38._isUnbound = RVar1._isUnbound;
    setLower(__return_storage_ptr__,&local_38);
    local_48._isUnbound = (other->_minimum)._isUnbound;
    local_48._val = (other->_minimum)._val;
    RVar1 = RangeValue::operator-(&this->_maximum,&local_48);
    local_38._val = RVar1._val;
    local_38._isUnbound = RVar1._isUnbound;
    setUpper(__return_storage_ptr__,&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

ShapeRange ShapeRange::operator- (const ShapeRange& other) const {
    ShapeRange out;
    if (other.isUnbound() && this->isUnbound()) {
        return out;
    }
    out.setLower(_minimum - other.maximum());
    out.setUpper(_maximum - other.minimum());
    return out;
}